

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void extra_tell_used_size(ctl_extr_rec *ctl,int size)

{
  int *piVar1;
  extr_rec *peVar2;
  
  if ((ctl->use_extr != 0) &&
     (peVar2 = (ctl->isoent->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0)) {
    piVar1 = &peVar2->offset;
    *piVar1 = *piVar1 + size;
  }
  ctl->cur_len = ctl->cur_len + size;
  return;
}

Assistant:

static void
extra_tell_used_size(struct ctl_extr_rec *ctl, int size)
{
	struct isoent *isoent;
	struct extr_rec *rec;

	if (ctl->use_extr) {
		isoent = ctl->isoent->parent;
		rec = isoent->extr_rec_list.current;
		if (rec != NULL)
			rec->offset += size;
	}
	ctl->cur_len += size;
}